

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjDumpParser.cpp
# Opt level: O0

bool __thiscall ObjDumpParser::parseFunctionDecl(ObjDumpParser *this,char **data,size_t size)

{
  char *pcVar1;
  bool bVar2;
  char *endOfData;
  size_t size_local;
  char **data_local;
  ObjDumpParser *this_local;
  
  pcVar1 = *data;
  bVar2 = expectAddress(data);
  if ((bVar2) && (bVar2 = expectString<3ul>(data,(char (*) [3])" <"), bVar2)) {
    bVar2 = eqString<3ul>(pcVar1 + (size - 2),(char (*) [3])">:");
    if (bVar2) {
      pcVar1[size - 2] = '\0';
      this_local._7_1_ = ScParser::parseFunctionDecl(this->m_scParser,data);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ObjDumpParser::parseFunctionDecl(char *&data, std::size_t size)
{
    char *const endOfData = data + size - 2;

    if (!(expectAddress(data) && expectString(data, " <"))) {
        return false;
    }

    if (!eqString(endOfData, ">:")) {
        return false;
    }
    *endOfData = 0;

    return m_scParser.parseFunctionDecl(data);
}